

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall SSTable::fillData(SSTable *this,SSTableData *new_data)

{
  bool bVar1;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *pvVar2;
  pointer pSVar3;
  pointer pSVar4;
  vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_00;
  size_t sVar5;
  SSTableHeader *pSVar6;
  value_type local_90;
  SSTableDataEntry *local_80;
  SSTableDataEntry *item;
  iterator __end1;
  iterator __begin1;
  SSTableData *__range1;
  size_t item_bytes;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_50;
  pointer local_48;
  size_t entries_count;
  size_t file_offset;
  longlong key_max;
  longlong key_min;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *local_18;
  SSTableData *new_data_local;
  SSTable *this_local;
  
  local_18 = new_data;
  new_data_local = (SSTableData *)this;
  pvVar2 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(pvVar2,local_18);
  this->data = pvVar2;
  key_max = 0;
  file_offset = 0;
  entries_count = 0;
  local_48 = (pointer)std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::size
                                (this->data);
  local_50._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin(this->data);
  pSVar3 = __gnu_cxx::
           __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
           ::operator->(&local_50);
  key_max = pSVar3->key;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::rbegin
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)&item_bytes);
  pSVar4 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
                         *)&item_bytes);
  file_offset = pSVar4->key;
  entries_count = 0x20;
  this_00 = (vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::vector(this_00);
  this->index = this_00;
  pvVar2 = this->data;
  __end1 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin(pvVar2);
  item = (SSTableDataEntry *)
         std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                                *)&item);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
               ::operator*(&__end1);
    local_90.key = local_80->key;
    local_90.offset = entries_count;
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::push_back
              (this->index,&local_90);
    sVar5 = size_of_entry(local_80);
    entries_count = sVar5 + entries_count;
    __gnu_cxx::
    __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
    ::operator++(&__end1);
  }
  pSVar6 = (SSTableHeader *)operator_new(0x20);
  pSVar6->index_offset = entries_count;
  pSVar6->entries_count = (size_t)local_48;
  pSVar6->key_min = key_max;
  pSVar6->key_max = file_offset;
  this->header = pSVar6;
  return;
}

Assistant:

void SSTable::fillData(SSTableData &new_data) {
    data = new SSTableData{new_data};
    long long key_min = 0, key_max = 0;
    size_t file_offset = 0, entries_count = data->size();
    // Determining header.
    key_min = data->begin()->key;
    key_max = data->rbegin()->key;
    file_offset = 32; // Header use 32 bytes.
    size_t item_bytes = 0;
    index = new SSTableIndex{};
    for (const auto &item:*data) {
        index->push_back({item.key, file_offset});
        item_bytes = size_of_entry(item);
        file_offset += item_bytes;
    }
    header = new SSTableHeader{file_offset, entries_count, key_min, key_max};
}